

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float128 addFloat128Sigs(float128 a,float128 b,flag zSign,float_status *status)

{
  undefined1 auVar1 [16];
  int count;
  ulong uVar2;
  uint uVar3;
  ulong a1;
  ulong uVar4;
  uint zExp;
  ulong a0;
  ulong uVar5;
  float128 fVar6;
  uint64_t bSig0;
  uint64_t bSig1;
  uint64_t aSig1;
  uint64_t local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar5 = b.low;
  a1 = a.low;
  a0 = a.high & 0xffffffffffff;
  zExp = a.high._6_2_ & 0x7fff;
  uVar4 = b.high & 0xffffffffffff;
  uVar3 = b.high._6_2_ & 0x7fff;
  count = zExp - uVar3;
  local_50 = uVar4;
  local_48 = a0;
  local_40 = uVar5;
  local_38 = a1;
  if (count == 0 || zExp < uVar3) {
    if (count < 0) {
      if (uVar3 == 0x7fff) {
        if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
            uVar5 == 0) {
          uVar5 = (ulong)zSign << 0x3f | 0x7fff000000000000;
          goto LAB_00b1dfd7;
        }
        goto LAB_00b1deb5;
      }
      if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
        count = count + 1;
      }
      else {
        a0 = a0 | 0x1000000000000;
      }
      local_48 = a0;
      shift128ExtraRightJamming(a0,a1,0,-count,&local_48,&local_38,&local_58);
      a1 = local_38;
      a0 = local_48;
      zExp = uVar3;
      goto LAB_00b1df17;
    }
    if (zExp == 0x7fff) {
      if (((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
           a1 == 0) && uVar5 == 0) &&
          ((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0) {
        return a;
      }
LAB_00b1deb5:
      fVar6 = propagateFloat128NaN(a,b,status);
      return fVar6;
    }
    uVar2 = uVar5 + a1;
    uVar5 = uVar4 + a0 + (ulong)CARRY8(uVar5,a1);
    if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (status->flush_to_zero == '\0') {
        fVar6.high = (ulong)zSign << 0x3f | uVar5;
        fVar6.low = uVar2;
        return fVar6;
      }
      if (uVar5 != 0 || uVar2 != 0) {
        status->float_exception_flags = status->float_exception_flags | 0x80;
      }
      uVar5 = (ulong)zSign << 0x3f;
LAB_00b1dfd7:
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar5;
      return (float128)(auVar1 << 0x40);
    }
    uVar5 = uVar5 | 0x2000000000000;
    local_58 = 0;
  }
  else {
    if (zExp == 0x7fff) {
      if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          a1 == 0) {
        return a;
      }
      goto LAB_00b1deb5;
    }
    if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      count = count + -1;
    }
    else {
      uVar4 = uVar4 | 0x1000000000000;
    }
    local_50 = uVar4;
    shift128ExtraRightJamming(uVar4,uVar5,0,count,&local_50,&local_40,&local_58);
    uVar5 = local_40;
    uVar4 = local_50;
LAB_00b1df17:
    uVar2 = uVar5 + a1;
    uVar5 = (a0 | 0x1000000000000) + uVar4 + (ulong)CARRY8(uVar5,a1);
    if (uVar5 >> 0x31 == 0) {
      zExp = zExp - 1;
      uVar4 = uVar2;
      goto LAB_00b1df67;
    }
    local_58 = (uint64_t)(local_58 != 0);
  }
  uVar4 = uVar5 << 0x3f | uVar2 >> 1;
  local_58 = uVar2 << 0x3f | local_58;
  uVar5 = uVar5 >> 1;
LAB_00b1df67:
  fVar6 = roundAndPackFloat128(zSign,zExp,uVar5,uVar4,local_58,status);
  return fVar6;
}

Assistant:

static float128 addFloat128Sigs(float128 a, float128 b, flag zSign,
                                float_status *status)
{
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1, zSig2;
    int32_t expDiff;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    expDiff = aExp - bExp;
    if ( 0 < expDiff ) {
        if ( aExp == 0x7FFF ) {
            if (aSig0 | aSig1) {
                return propagateFloat128NaN(a, b, status);
            }
            return a;
        }
        if ( bExp == 0 ) {
            --expDiff;
        }
        else {
            bSig0 |= UINT64_C(0x0001000000000000);
        }
        shift128ExtraRightJamming(
            bSig0, bSig1, 0, expDiff, &bSig0, &bSig1, &zSig2 );
        zExp = aExp;
    }
    else if ( expDiff < 0 ) {
        if ( bExp == 0x7FFF ) {
            if (bSig0 | bSig1) {
                return propagateFloat128NaN(a, b, status);
            }
            return packFloat128( zSign, 0x7FFF, 0, 0 );
        }
        if ( aExp == 0 ) {
            ++expDiff;
        }
        else {
            aSig0 |= UINT64_C(0x0001000000000000);
        }
        shift128ExtraRightJamming(
            aSig0, aSig1, 0, - expDiff, &aSig0, &aSig1, &zSig2 );
        zExp = bExp;
    }
    else {
        if ( aExp == 0x7FFF ) {
            if ( aSig0 | aSig1 | bSig0 | bSig1 ) {
                return propagateFloat128NaN(a, b, status);
            }
            return a;
        }
        add128( aSig0, aSig1, bSig0, bSig1, &zSig0, &zSig1 );
        if ( aExp == 0 ) {
            if (status->flush_to_zero) {
                if (zSig0 | zSig1) {
                    float_raise(float_flag_output_denormal, status);
                }
                return packFloat128(zSign, 0, 0, 0);
            }
            return packFloat128( zSign, 0, zSig0, zSig1 );
        }
        zSig2 = 0;
        zSig0 |= UINT64_C(0x0002000000000000);
        zExp = aExp;
        goto shiftRight1;
    }
    aSig0 |= UINT64_C(0x0001000000000000);
    add128( aSig0, aSig1, bSig0, bSig1, &zSig0, &zSig1 );
    --zExp;
    if ( zSig0 < UINT64_C(0x0002000000000000) ) goto roundAndPack;
    ++zExp;
 shiftRight1:
    shift128ExtraRightJamming(
        zSig0, zSig1, zSig2, 1, &zSig0, &zSig1, &zSig2 );
 roundAndPack:
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}